

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

char * __thiscall cmCustomCommandGenerator::GetArgv0Location(cmCustomCommandGenerator *this,uint c)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  cmGeneratorTarget *this_01;
  string *psVar5;
  pointer pcVar6;
  cmValue cVar7;
  string local_70;
  string local_50;
  
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                      (this->LG,*(string **)
                                 &(this->CommandLines).
                                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  .
                                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ._M_impl.super__Vector_impl_data._M_start[c].
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      );
  if (this_01 != (cmGeneratorTarget *)0x0) {
    TVar4 = cmGeneratorTarget::GetType(this_01);
    if (TVar4 == EXECUTABLE) {
      bVar2 = cmGeneratorTarget::IsImported(this_01);
      if (bVar2) {
        bVar3 = true;
        bVar1 = false;
        bVar2 = false;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"CROSSCOMPILING_EMULATOR","");
        cVar7 = cmGeneratorTarget::GetProperty(this_01,&local_50);
        if (cVar7.Value == (string *)0x0) {
          this_00 = this->LG->Makefile;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"CMAKE_CROSSCOMPILING","");
          bVar3 = cmMakefile::IsOn(this_00,&local_70);
          bVar3 = !bVar3;
          bVar1 = true;
          bVar2 = true;
        }
        else {
          bVar1 = true;
          bVar2 = false;
          bVar3 = true;
        }
      }
      goto LAB_004ee8ff;
    }
  }
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
LAB_004ee8ff:
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    psVar5 = cmGeneratorTarget::GetLocation(this_01,&this->CommandConfig);
    pcVar6 = (psVar5->_M_dataplus)._M_p;
  }
  else {
    pcVar6 = (char *)0x0;
  }
  return pcVar6;
}

Assistant:

const char* cmCustomCommandGenerator::GetArgv0Location(unsigned int c) const
{
  // If the command is the plain name of an executable target, we replace it
  // with the path to the executable artifact in the command config.
  std::string const& argv0 = this->CommandLines[c][0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
      (target->IsImported() ||
       target->GetProperty("CROSSCOMPILING_EMULATOR") ||
       !this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING"))) {
    return target->GetLocation(this->CommandConfig).c_str();
  }
  return nullptr;
}